

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O3

void find_final_state(void)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)(*shift_table)->nshifts;
  do {
    if ((int)uVar1 < 1) {
      return;
    }
    final_state = (*shift_table)->shift[uVar1 - 1];
    uVar1 = uVar1 - 1;
  } while (accessing_symbol[final_state] != ritem[1]);
  return;
}

Assistant:

void find_final_state()
{
    register int goal, i;
    register Yshort *to_state;
    register shifts *p;

    p = shift_table[0];
    to_state = p->shift;
    goal = ritem[1];
    for (i = p->nshifts - 1; i >= 0; --i)
    {
	final_state = to_state[i];
	if (accessing_symbol[final_state] == goal) break;
    }
}